

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O1

bool __thiscall Clasp::Lookahead::propagateFixpoint(Lookahead *this,Solver *s,PostPropagator *ctx)

{
  size_type sVar1;
  pointer pLVar2;
  bool bVar3;
  bool bVar4;
  uint32 uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((((this->nodes_).ebo_.buf)->next != 0) && (this->top_ != (s->assign_).trail.ebo_.size)) ||
     (bVar4 = true, (this->score).deps.ebo_.size == 0)) {
    do {
      sVar1 = (s->levels_).super_type.ebo_.size;
      bVar4 = propagateLevel(this,s);
      if (bVar4) goto LAB_0018fef0;
      bVar3 = Solver::resolveConflict(s);
    } while ((bVar3) && (bVar3 = Solver::propagateUntil(s,&this->super_PostPropagator), bVar3));
    uVar6 = (ulong)(this->score).deps.ebo_.size;
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        (this->score).score.ebo_.buf[(this->score).deps.ebo_.buf[uVar7]] = (VarScore)0x0;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    (this->score).deps.ebo_.size = 0;
    (this->score).best = 0;
    (this->score).limit = 0xffffffff;
LAB_0018fef0:
    if ((bVar4 && sVar1 == 0) && ((this->score).limit != 0)) {
      this->top_ = (s->assign_).trail.ebo_.size;
      pLVar2 = (this->imps_).ebo_.buf;
      (this->imps_).ebo_.buf = (pointer)0x0;
      (this->imps_).ebo_.size = 0;
      (this->imps_).ebo_.cap = 0;
      if (pLVar2 != (pointer)0x0) {
        operator_delete(pLVar2);
      }
    }
    if (((ctx == (PostPropagator *)0x0) && (this->limit_ != 0)) &&
       (uVar5 = this->limit_ - 1, this->limit_ = uVar5, uVar5 == 0)) {
      (*(this->super_PostPropagator).super_Constraint._vptr_Constraint[5])(this,s,1);
    }
  }
  return bVar4;
}

Assistant:

bool Lookahead::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	if ((empty() || top_ == s.numAssignedVars()) && !score.deps.empty()) {
		// nothing to lookahead
		return true;
	}
	bool ok = true;
	uint32 dl;
	for (dl = s.decisionLevel(); !propagateLevel(s); dl = s.decisionLevel()) {
		// some literal failed
		// resolve and propagate conflict
		assert(s.decisionLevel() >= dl);
		if (!s.resolveConflict() || !s.propagateUntil(this)) {
			ok = false;
			score.clearDeps();
			break;
		}
	}
	if (ok && dl == 0 && score.limit > 0) {
		// remember top-level size - no need to redo lookahead
		// on level 0 unless we learn a new implication
		assert(s.queueSize() == 0);
		top_ = s.numAssignedVars();
		LitVec().swap(imps_);
	}
	if (!ctx && limit_ && --limit_ == 0) {
		this->destroy(&s, true);
	}
	return ok;
}